

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_244bb14::HBDMinMaxTest_MinValue_Test::TestBody(HBDMinMaxTest_MinValue_Test *this)

{
  int iVar1;
  bool bVar2;
  undefined8 *puVar3;
  void *pvVar4;
  void *pvVar5;
  pointer *__ptr;
  SEARCH_METHODS *pSVar6;
  undefined1 (*memblk) [16];
  undefined4 *memblk_00;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  int min;
  RegisterStateCheckMMX reg_check_mmx;
  int max;
  Message local_88;
  int local_80;
  int local_7c;
  internal local_78 [8];
  undefined2 local_70;
  undefined2 uStack_6e;
  undefined4 uStack_6c;
  undefined2 uStack_68;
  AssertHelper local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  HBDMinMaxTest_MinValue_Test *local_40;
  int local_34;
  
  local_40 = this;
  pvVar4 = aom_malloc(0x80);
  local_48 = (uint8_t *)((ulong)pvVar4 >> 1);
  pvVar5 = aom_malloc(0x80);
  local_50 = (uint8_t *)((ulong)pvVar5 >> 1);
  memblk = (undefined1 (*) [16])((ulong)pvVar4 & 0xfffffffffffffffe);
  memblk_00 = (undefined4 *)((ulong)pvVar5 & 0xfffffffffffffffe);
  local_80 = 0;
  do {
    local_78[0] = SUB21(in_FPUControlWord,0);
    memblk[7] = (undefined1  [16])0x0;
    memblk[6] = (undefined1  [16])0x0;
    memblk[5] = (undefined1  [16])0x0;
    memblk[4] = (undefined1  [16])0x0;
    memblk[3] = (undefined1  [16])0x0;
    memblk[2] = (undefined1  [16])0x0;
    memblk[1] = (undefined1  [16])0x0;
    *memblk = (undefined1  [16])0x0;
    memblk_00[0x1c] = 0xffffffff;
    memblk_00[0x1d] = 0xffffffff;
    memblk_00[0x1e] = 0xffffffff;
    memblk_00[0x1f] = 0xffffffff;
    memblk_00[0x18] = 0xffffffff;
    memblk_00[0x19] = 0xffffffff;
    memblk_00[0x1a] = 0xffffffff;
    memblk_00[0x1b] = 0xffffffff;
    memblk_00[0x14] = 0xffffffff;
    memblk_00[0x15] = 0xffffffff;
    memblk_00[0x16] = 0xffffffff;
    memblk_00[0x17] = 0xffffffff;
    memblk_00[0x10] = 0xffffffff;
    memblk_00[0x11] = 0xffffffff;
    memblk_00[0x12] = 0xffffffff;
    memblk_00[0x13] = 0xffffffff;
    memblk_00[0xc] = 0xffffffff;
    memblk_00[0xd] = 0xffffffff;
    memblk_00[0xe] = 0xffffffff;
    memblk_00[0xf] = 0xffffffff;
    memblk_00[8] = 0xffffffff;
    memblk_00[9] = 0xffffffff;
    memblk_00[10] = 0xffffffff;
    memblk_00[0xb] = 0xffffffff;
    memblk_00[4] = 0xffffffff;
    memblk_00[5] = 0xffffffff;
    memblk_00[6] = 0xffffffff;
    memblk_00[7] = 0xffffffff;
    *memblk_00 = 0xffffffff;
    memblk_00[1] = 0xffffffff;
    memblk_00[2] = 0xffffffff;
    memblk_00[3] = 0xffffffff;
    *(short *)((long)memblk_00 + (long)local_80 * 2) = (short)local_80;
    uStack_6c = (undefined4)in_FPUInstructionPointer;
    uStack_68 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    local_70 = in_FPUTagWord;
    (*(local_40->super_HBDMinMaxTest).mm_func_)(local_48,8,local_50,8,&local_7c,&local_34);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)local_78);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0xffff;
    testing::internal::CmpHelperEQ<int,int>(local_78,"65535","max",(int *)&local_88,&local_34);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      puVar3 = (undefined8 *)CONCAT44(uStack_6c,CONCAT22(uStack_6e,local_70));
      pSVar6 = "";
      if (puVar3 != (undefined8 *)0x0) {
        pSVar6 = (SEARCH_METHODS *)*puVar3;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x9b,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_58,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    puVar3 = (undefined8 *)CONCAT44(uStack_6c,CONCAT22(uStack_6e,local_70));
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    testing::internal::CmpHelperEQ<int,int>(local_78,"i","min",&local_80,&local_7c);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message(&local_88);
      puVar3 = (undefined8 *)CONCAT44(uStack_6c,CONCAT22(uStack_6e,local_70));
      pSVar6 = "";
      if (puVar3 != (undefined8 *)0x0) {
        pSVar6 = (SEARCH_METHODS *)*puVar3;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x9c,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_58,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    puVar3 = (undefined8 *)CONCAT44(uStack_6c,CONCAT22(uStack_6e,local_70));
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    iVar1 = local_80 + 1;
    bVar2 = local_80 < 0x3f;
    local_80 = iVar1;
  } while (bVar2);
  aom_free(memblk);
  aom_free(memblk_00);
  return;
}

Assistant:

TEST_P(HBDMinMaxTest, MinValue) {
  uint8_t *a = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  uint8_t *b = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  for (int i = 0; i < 64; i++) {
    aom_memset16(CONVERT_TO_SHORTPTR(a), 0, 64);
    aom_memset16(CONVERT_TO_SHORTPTR(b), 65535, 64);
    CONVERT_TO_SHORTPTR(b)[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(65535, max);
    EXPECT_EQ(i, min);
  }
  aom_free(CONVERT_TO_SHORTPTR(a));
  aom_free(CONVERT_TO_SHORTPTR(b));
}